

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkObj.c
# Opt level: O1

void Nwk_ManDeleteNode(Nwk_Obj_t *pObj)

{
  int *piVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  
  if (pObj->nFanouts != 0) {
    __assert_fail("Nwk_ObjFanoutNum(pObj) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkObj.c"
                  ,0xa0,"void Nwk_ManDeleteNode(Nwk_Obj_t *)");
  }
  pVVar3 = pObj->pMan->vTemp;
  Nwk_ObjCollectFanins(pObj,pVVar3);
  if (0 < pVVar3->nSize) {
    lVar4 = 0;
    do {
      Nwk_ObjDeleteFanin(pObj,(Nwk_Obj_t *)pVVar3->pArray[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar4 < pVVar3->nSize);
  }
  iVar2 = pObj->Id;
  if ((-1 < (long)iVar2) && (pVVar3 = pObj->pMan->vObjs, iVar2 < pVVar3->nSize)) {
    pVVar3->pArray[iVar2] = (void *)0x0;
    piVar1 = pObj->pMan->nObjs + (*(uint *)&pObj->field_0x20 & 7);
    *piVar1 = *piVar1 + -1;
    *(undefined8 *)&pObj->field_0x20 = 0;
    pObj->TravId = 0;
    pObj->Level = 0;
    pObj->nFanouts = 0;
    pObj->nFanioAlloc = 0;
    pObj->pFanio = (Nwk_Obj_t **)0x0;
    pObj->tArrival = 0.0;
    pObj->tRequired = 0.0;
    pObj->tSlack = 0.0;
    pObj->nFanins = 0;
    pObj->pCopy = (void *)0x0;
    (pObj->field_3).pNext = (void *)0x0;
    pObj->pMan = (Nwk_Man_t *)0x0;
    pObj->pFunc = (Hop_Obj_t *)0x0;
    pObj->Id = -1;
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
}

Assistant:

void Nwk_ManDeleteNode( Nwk_Obj_t * pObj )
{
    Vec_Ptr_t * vNodes = pObj->pMan->vTemp;
    Nwk_Obj_t * pTemp;
    int i;
    assert( Nwk_ObjFanoutNum(pObj) == 0 );
    // delete fanins
    Nwk_ObjCollectFanins( pObj, vNodes );
    Vec_PtrForEachEntry( Nwk_Obj_t *, vNodes, pTemp, i )
        Nwk_ObjDeleteFanin( pObj, pTemp );
    // remove from the list of objects
    Vec_PtrWriteEntry( pObj->pMan->vObjs, pObj->Id, NULL );
    pObj->pMan->nObjs[pObj->Type]--;
    memset( pObj, 0, sizeof(Nwk_Obj_t) );
    pObj->Id = -1;
}